

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rang.hpp
# Opt level: O0

bool rang::rang_implementation::isTerminal(streambuf *osbuf)

{
  byte bVar1;
  int iVar2;
  streambuf *psVar3;
  streambuf *osbuf_local;
  
  psVar3 = (streambuf *)std::ios::rdbuf();
  if (osbuf == psVar3) {
    bVar1 = isTerminal::cout_term;
    if ((isTerminal(std::streambuf_const*)::cout_term == '\0') &&
       (iVar2 = __cxa_guard_acquire(&isTerminal(std::streambuf_const*)::cout_term),
       bVar1 = isTerminal::cout_term, iVar2 != 0)) {
      iVar2 = fileno(_stdout);
      iVar2 = isatty(iVar2);
      isTerminal::cout_term = iVar2 != 0;
      __cxa_guard_release(&isTerminal(std::streambuf_const*)::cout_term);
      bVar1 = isTerminal::cout_term;
    }
  }
  else {
    psVar3 = (streambuf *)std::ios::rdbuf();
    if ((osbuf != psVar3) && (psVar3 = (streambuf *)std::ios::rdbuf(), osbuf != psVar3)) {
      return false;
    }
    bVar1 = isTerminal::cerr_term;
    if ((isTerminal(std::streambuf_const*)::cerr_term == '\0') &&
       (iVar2 = __cxa_guard_acquire(&isTerminal(std::streambuf_const*)::cerr_term),
       bVar1 = isTerminal::cerr_term, iVar2 != 0)) {
      iVar2 = fileno(_stderr);
      iVar2 = isatty(iVar2);
      isTerminal::cerr_term = iVar2 != 0;
      __cxa_guard_release(&isTerminal(std::streambuf_const*)::cerr_term);
      bVar1 = isTerminal::cerr_term;
    }
  }
  osbuf_local._7_1_ = (bool)(bVar1 & 1);
  return osbuf_local._7_1_;
}

Assistant:

inline bool isTerminal(const std::streambuf *osbuf) noexcept
    {
        using std::cerr;
        using std::clog;
        using std::cout;
#if defined(OS_LINUX) || defined(OS_MAC)
        if (osbuf == cout.rdbuf()) {
            static const bool cout_term = isatty(fileno(stdout)) != 0;
            return cout_term;
        } else if (osbuf == cerr.rdbuf() || osbuf == clog.rdbuf()) {
            static const bool cerr_term = isatty(fileno(stderr)) != 0;
            return cerr_term;
        }
#elif defined(OS_WIN)
        if (osbuf == cout.rdbuf()) {
            static const bool cout_term
              = (_isatty(_fileno(stdout)) || isMsysPty(_fileno(stdout)));
            return cout_term;
        } else if (osbuf == cerr.rdbuf() || osbuf == clog.rdbuf()) {
            static const bool cerr_term
              = (_isatty(_fileno(stderr)) || isMsysPty(_fileno(stderr)));
            return cerr_term;
        }
#endif
        return false;
    }